

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O0

roaring_container_iterator_t
container_init_iterator_last(container_t *c,uint8_t typecode,uint16_t *value)

{
  unsigned_long_long input_num;
  int iVar1;
  short *psVar2;
  short *in_RDX;
  char in_SIL;
  int *in_RDI;
  rle16_t *last_run;
  int32_t run_index;
  run_container_t *rc;
  int32_t index_1;
  array_container_t *ac;
  int32_t index;
  uint64_t word;
  uint32_t wordindex;
  bitset_container_t *bc;
  uint local_2c;
  int local_4;
  
  if (in_SIL == '\x01') {
    local_2c = 0x3ff;
    while (input_num = *(unsigned_long_long *)(*(long *)(in_RDI + 2) + (ulong)local_2c * 8),
          input_num == 0) {
      local_2c = local_2c - 1;
    }
    iVar1 = roaring_leading_zeroes(input_num);
    local_4 = local_2c * 0x40 + (0x3f - iVar1);
    *in_RDX = (short)local_4;
  }
  else if (in_SIL == '\x02') {
    local_4 = *in_RDI + -1;
    *in_RDX = *(short *)(*(long *)(in_RDI + 2) + (long)local_4 * 2);
  }
  else {
    local_4 = *in_RDI + -1;
    psVar2 = (short *)(*(long *)(in_RDI + 2) + (long)local_4 * 4);
    *in_RDX = *psVar2 + psVar2[1];
  }
  return (roaring_container_iterator_t)local_4;
}

Assistant:

roaring_container_iterator_t container_init_iterator_last(const container_t *c,
                                                          uint8_t typecode,
                                                          uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = BITSET_CONTAINER_SIZE_IN_WORDS - 1;
            uint64_t word;
            while ((word = bc->words[wordindex]) == 0) {
                wordindex--;
            }
            // word is non-zero
            int32_t index =
                wordindex * 64 + (63 - roaring_leading_zeroes(word));
            *value = index;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = index,
            };
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            int32_t index = ac->cardinality - 1;
            *value = ac->array[index];
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = index,
            };
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            int32_t run_index = rc->n_runs - 1;
            const rle16_t *last_run = &rc->runs[run_index];
            *value = last_run->value + last_run->length;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = run_index,
            };
        }
        default:
            assert(false);
            roaring_unreachable;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{0};
    }
}